

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

PublicationInfo * __thiscall
helics::InterfaceInfo::getPublication(InterfaceInfo *this,InterfaceHandle handle)

{
  PublicationInfo *pPVar1;
  shared_mutex *__rwlock;
  InterfaceHandle local_1c;
  
  __rwlock = &(this->publications).m_mutex;
  local_1c.hid = handle.hid;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  pPVar1 = gmlc::containers::
           DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(&(this->publications).m_obj,&local_1c);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return pPVar1;
}

Assistant:

const PublicationInfo* InterfaceInfo::getPublication(InterfaceHandle handle) const
{
    return publications.lock()->find(handle);
}